

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *arena;
  string *from;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *to;
  long lVar2;
  
  iVar1 = length;
  if (already_allocated < length) {
    iVar1 = already_allocated;
  }
  for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
    GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Merge((string *)other_elems[lVar2],(string *)our_elems[lVar2]);
  }
  arena = this->arena_;
  for (lVar2 = (long)already_allocated; lVar2 < length; lVar2 = lVar2 + 1) {
    from = (string *)other_elems[lVar2];
    to = GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::New(arena);
    GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Merge(from,to);
    our_elems[lVar2] = to;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(
    void** our_elems, void** other_elems, int length, int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArenaNoVirtual();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}